

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O0

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::initperfvalues
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this)

{
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_local;
  
  (this->m_perfv).panel_size = 1;
  (this->m_perfv).relax = 1;
  (this->m_perfv).maxsuper = 0x80;
  (this->m_perfv).rowblk = 0x10;
  (this->m_perfv).colblk = 8;
  (this->m_perfv).fillfactor = 0x14;
  return;
}

Assistant:

void initperfvalues()
    {
      m_perfv.panel_size = 1;
      m_perfv.relax = 1; 
      m_perfv.maxsuper = 128; 
      m_perfv.rowblk = 16; 
      m_perfv.colblk = 8; 
      m_perfv.fillfactor = 20;  
    }